

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::CheckElementShapeDimension(TPZCheckMesh *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TPZCompEl **ppTVar6;
  long *plVar7;
  long lVar8;
  ostream *poVar9;
  TPZConnect *pTVar10;
  long *plVar11;
  ulong nelem;
  int iVar12;
  int local_54;
  
  uVar2 = (uint)(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if ((int)uVar2 < 1) {
    local_54 = 0;
  }
  else {
    nelem = 0;
    local_54 = 0;
    do {
      ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (((*ppTVar6 != (TPZCompEl *)0x0) &&
          (plVar7 = (long *)__dynamic_cast(*ppTVar6,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0),
          plVar7 != (long *)0x0)) && (iVar3 = (**(code **)(*plVar7 + 0x90))(plVar7), 0 < iVar3)) {
        iVar12 = 0;
        do {
          iVar4 = (**(code **)(*plVar7 + 0xa0))(plVar7,iVar12);
          lVar8 = (**(code **)(*plVar7 + 0xa8))(plVar7,iVar12);
          iVar5 = (**(code **)(*plVar7 + 0x260))(plVar7,iVar12,*(undefined1 *)(lVar8 + 0x14));
          if (*(int *)(lVar8 + 0x18) != iVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ",0x22);
            poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(int)nelem);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," connect = ",0xb);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," nshape = ",10);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," c.NShape ",10);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            local_54 = 1;
          }
          this->fNState = 1;
          pTVar10 = TPZChunkVector<TPZConnect,_10>::operator[]
                              (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                               (long)iVar4);
          iVar1 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                  [(int)pTVar10->fSequenceNumber].dim;
          if (this->fNState * iVar5 != iVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ",0x22);
            poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(int)nelem);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," connect = ",0xb);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," nshape = ",10);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," blsize ",8);
            plVar11 = (long *)std::ostream::operator<<(poVar9,iVar1);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
            (**(code **)(*plVar7 + 200))(plVar7,&std::cout);
            local_54 = 1;
          }
          iVar12 = iVar12 + 1;
        } while (iVar3 != iVar12);
      }
      nelem = nelem + 1;
    } while (nelem != (uVar2 & 0x7fffffff));
  }
  return local_54;
}

Assistant:

int TPZCheckMesh::CheckElementShapeDimension() {
	int check = 0;
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
		TPZInterpolatedElement *cint = dynamic_cast<TPZInterpolatedElement *> (cel);
		if(!cint) continue;
		int nc = cint->NConnects();
		int ic;
		for(ic=0; ic<nc; ic++) {
			int cind = cint->ConnectIndex(ic);
            TPZConnect &c = cint->Connect(ic);
			int nshape = cint->NConnectShapeF(ic,c.Order());
            if (c.NShape() != nshape) {
                cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
                << cind << " nshape = " << nshape << " c.NShape " << c.NShape() << endl;
                check =1 ;
            }
			fNState = 1;                                                      /// WARNING
			int seqnum = fMesh->ConnectVec()[cind].SequenceNumber();
			int blsize = fMesh->Block().Size(seqnum);
			if(nshape*fNState != blsize) {
				cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
				<< cind << " nshape = " << nshape << " blsize " << blsize << endl;
				cint->Print(cout);
				check = 1;
			}
		}
	}
	return check;
}